

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadPolH_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  Node *msh;
  _Map_pointer pppNVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  uint uVar10;
  __normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>
  __tmp;
  VertexIndex __p;
  _Base_ptr p_Var11;
  Node *pNVar12;
  _Base_ptr p_Var13;
  undefined1 *puVar14;
  aiVector3D *v;
  _Map_pointer pppNVar15;
  _func_int **pp_Var16;
  long lVar17;
  long lVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Elt_pointer ppNVar19;
  bool bVar20;
  float fVar21;
  chunk_guard cn;
  size_type local_200;
  string local_1f8;
  iterator *local_1d0;
  size_type local_1c8;
  chunk_guard local_1c0;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  pointer local_198;
  pointer pVStack_190;
  
  if (8 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"PolH");
    return;
  }
  local_1c0.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  local_1c0.nfo = nfo;
  local_1c0.reader = reader;
  __p = (VertexIndex)operator_new(0x158);
  COB::Node::Node((Node *)__p,TYPE_MESH);
  *(undefined ***)__p = &PTR__Mesh_008cac88;
  (((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)((long)__p + 0xd8))->
  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)__p + 0xe0) = (pointer)0x0;
  *(pointer *)((long)__p + 0xe8) = (pointer)0x0;
  (((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)((long)__p + 0xf0))->
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)__p + 0xf8) = (pointer)0x0;
  *(pointer *)((long)__p + 0x100) = (pointer)0x0;
  (((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)((long)__p + 0x108))->
  super__Vector_base<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)__p + 0x110) = (pointer)0x0;
  *(pointer *)((long)__p + 0x118) = (pointer)0x0;
  *(uint *)((long)__p + 0x120) = 1;
  p_Var13 = (_Base_ptr)((long)__p + 0x130);
  (((_Rb_tree_header *)((long)__p + 0x130))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)__p + 0x138) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)__p + 0x140) = p_Var13;
  *(_Base_ptr *)((long)__p + 0x148) = p_Var13;
  *(size_t *)((long)__p + 0x150) = 0;
  local_1f8._M_dataplus._M_p = (pointer)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::COB::Mesh*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,(Mesh *)__p);
  local_1a8 = (undefined1  [8])local_1f8._M_dataplus._M_p;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length;
  local_1f8._M_dataplus._M_p = (pointer)0x0;
  local_1f8._M_string_length = 0;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,(shared_ptr<Assimp::COB::Node> *)local_1a8);
  if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
  }
  p_Var11 = (_Base_ptr)
            (out->nodes).
            super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (p_Var11 ==
      (_Base_ptr)
      (out->nodes).
      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    p_Var13 = (_Base_ptr)
              (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    p_Var11 = p_Var13[-1]._M_right + 0x10;
  }
  msh = (Node *)p_Var11[-1]._M_left;
  uVar10 = nfo->parent_id;
  uVar4 = nfo->version;
  uVar5 = nfo->size;
  (msh->super_ChunkInfo).id = nfo->id;
  (msh->super_ChunkInfo).parent_id = uVar10;
  (msh->super_ChunkInfo).version = uVar4;
  (msh->super_ChunkInfo).size = uVar5;
  ReadBasicNodeInfo_Binary((COBImporter *)this_00,msh,reader,(ChunkInfo *)p_Var13);
  iVar9 = StreamReader<false,_false>::Get<int>(reader);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&msh[1].type,
             (long)iVar9);
  pppNVar1 = msh[1].temp_children.
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_map;
  for (pppNVar15 = *(_Map_pointer *)&msh[1].type; pppNVar15 != pppNVar1;
      pppNVar15 = (_Map_pointer)((long)pppNVar15 + 0xc)) {
    fVar21 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)pppNVar15 = fVar21;
    fVar21 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)((long)pppNVar15 + 4) = fVar21;
    fVar21 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)(pppNVar15 + 1) = fVar21;
  }
  iVar9 = StreamReader<false,_false>::Get<int>(reader);
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)(msh + 1),(long)iVar9
            );
  pp_Var2 = *(_func_int ***)&msh[1].super_ChunkInfo;
  for (pp_Var16 = msh[1]._vptr_Node; pp_Var16 != pp_Var2; pp_Var16 = pp_Var16 + 1) {
    fVar21 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)pp_Var16 = fVar21;
    fVar21 = StreamReader<false,_false>::Get<float>(reader);
    *(float *)((long)pp_Var16 + 4) = fVar21;
  }
  iVar9 = StreamReader<false,_false>::Get<int>(reader);
  local_1c8 = (size_type)iVar9;
  local_1d0 = &msh[1].temp_children.
               super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
               ._M_impl.super__Deque_impl_data._M_start;
  std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::reserve
            ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)local_1d0,local_1c8);
  if (iVar9 != 0) {
    local_200 = 0;
    do {
      bVar6 = StreamReader<false,_false>::Get<signed_char>(reader);
      if ((bVar6 & 8) == 0) {
        local_198 = (pointer)0x0;
        pVStack_190 = (pointer)0x0;
        local_1a8._0_4_ = 0;
        local_1a8._4_4_ = 0;
        _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::
        emplace_back<Assimp::COB::Face>
                  ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)local_1d0,
                   (Face *)local_1a8);
        if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          operator_delete(_Stack_1a0._M_pi,(long)pVStack_190 - (long)_Stack_1a0._M_pi);
        }
        ppNVar19 = msh[1].temp_children.
                   super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
      }
      else {
        ppNVar19 = msh[1].temp_children.
                   super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
        if (msh[1].temp_children.
            super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur == ppNVar19) {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [56])"A hole is the first entity in the `PolH` chunk with id ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          ThrowException(&local_1f8);
        }
      }
      sVar7 = StreamReader<false,_false>::Get<short>(reader);
      lVar18 = (long)sVar7;
      std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::reserve
                ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
                 (ppNVar19 + -3),((long)ppNVar19[-2] - (long)ppNVar19[-3] >> 3) + lVar18);
      if ((bVar6 & 8) == 0) {
        sVar8 = StreamReader<false,_false>::Get<short>(reader);
        *(int *)(ppNVar19 + -4) = (int)sVar8;
        *(undefined4 *)((long)ppNVar19 + -0x1c) = 0;
      }
      lVar17 = lVar18;
      if (sVar7 != 0) {
        do {
          local_1a8._0_4_ = 0;
          local_1a8._4_4_ = 0;
          std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::
          emplace_back<Assimp::COB::VertexIndex>
                    ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
                     (ppNVar19 + -3),(VertexIndex *)local_1a8);
          pNVar12 = ppNVar19[-2];
          fVar21 = (float)StreamReader<false,_false>::Get<int>(reader);
          pNVar12[-1].unit_scale = fVar21;
          iVar9 = StreamReader<false,_false>::Get<int>(reader);
          *(int *)&pNVar12[-1].field_0xd4 = iVar9;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
      if ((((bVar6 & 8) != 0) && (sVar7 != 0)) &&
         (pNVar12 = ppNVar19[-2], (Node *)((long)pNVar12 + lVar18 * -8 + 8) < pNVar12)) {
        puVar14 = (undefined1 *)((long)pNVar12 + lVar18 * -8 + 0x10);
        do {
          uVar3 = *(undefined8 *)&pNVar12[-1].unit_scale;
          *(undefined8 *)&pNVar12[-1].unit_scale = *(undefined8 *)(puVar14 + -0x10);
          pNVar12 = (Node *)&pNVar12[-1].unit_scale;
          *(undefined8 *)(puVar14 + -0x10) = uVar3;
          bVar20 = puVar14 < pNVar12;
          puVar14 = puVar14 + 8;
        } while (bVar20);
      }
      local_200 = local_200 + 1;
    } while (local_200 != local_1c8);
  }
  uVar10 = nfo->version;
  if (4 < uVar10) {
    iVar9 = StreamReader<false,_false>::Get<int>(reader);
    *(int *)&msh[1].temp_children.
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node = iVar9;
    uVar10 = nfo->version;
  }
  if ((uVar10 & 0xfffffffe) == 6) {
    StreamReader<false,_false>::Get<int>(reader);
  }
  chunk_guard::~chunk_guard(&local_1c0);
  return;
}

Assistant:

void COBImporter::ReadPolH_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Binary(reader,nfo,"PolH");
    }
    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::shared_ptr<Mesh>(new Mesh()));
    Mesh& msh = (Mesh&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);

    msh.vertex_positions.resize(reader.GetI4());
    for(aiVector3D& v : msh.vertex_positions) {
        v.x = reader.GetF4();
        v.y = reader.GetF4();
        v.z = reader.GetF4();
    }

    msh.texture_coords.resize(reader.GetI4());
    for(aiVector2D& v : msh.texture_coords) {
        v.x = reader.GetF4();
        v.y = reader.GetF4();
    }

    const size_t numf = reader.GetI4();
    msh.faces.reserve(numf);
    for(size_t i = 0; i < numf; ++i) {
        // XXX backface culling flag is 0x10 in flags

        // hole?
        bool hole;
        if ((hole = (reader.GetI1() & 0x08) != 0)) {
            // XXX Basically this should just work fine - then triangulator
            // should output properly triangulated data even for polygons
            // with holes. Test data specific to COB is needed to confirm it.
            if (msh.faces.empty()) {
                ThrowException(format("A hole is the first entity in the `PolH` chunk with id ") << nfo.id);
            }
        }
        else msh.faces.push_back(Face());
        Face& f = msh.faces.back();

        const size_t num = reader.GetI2();
        f.indices.reserve(f.indices.size() + num);

        if(!hole) {
            f.material = reader.GetI2();
            f.flags = 0;
        }

        for(size_t x = 0; x < num; ++x) {
            f.indices.push_back(VertexIndex());

            VertexIndex& v = f.indices.back();
            v.pos_idx = reader.GetI4();
            v.uv_idx = reader.GetI4();
        }

        if(hole) {
            std::reverse(f.indices.rbegin(),f.indices.rbegin()+num);
        }
    }
    if (nfo.version>4) {
        msh.draw_flags = reader.GetI4();
    }
    nfo.version>5 && nfo.version<8 ? reader.GetI4() : 0;
}